

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O1

void __thiscall JsrtRuntime::~JsrtRuntime(JsrtRuntime *this)

{
  AllocationPolicyManager *this_00;
  JsrtDebugManager *this_01;
  
  this_00 = this->allocationPolicyManager;
  AllocationPolicyManager::~AllocationPolicyManager(this_00);
  Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_00,0x68);
  this_01 = this->jsrtDebugManager;
  if (this_01 != (JsrtDebugManager *)0x0) {
    JsrtDebugManager::~JsrtDebugManager(this_01);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_01,0x68);
    this->jsrtDebugManager = (JsrtDebugManager *)0x0;
  }
  JsrtThreadService::~JsrtThreadService(&this->threadService);
  return;
}

Assistant:

JsrtRuntime::~JsrtRuntime()
{
    HeapDelete(allocationPolicyManager);
#ifdef ENABLE_SCRIPT_DEBUGGING
    if (this->jsrtDebugManager != nullptr)
    {
        HeapDelete(this->jsrtDebugManager);
        this->jsrtDebugManager = nullptr;
    }
#endif
}